

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall icu_63::Locale::initBaseName(Locale *this,UErrorCode *status)

{
  char *__s;
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  size_t __n;
  int iVar4;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  __s = this->fullName;
  pcVar1 = strchr(__s,0x40);
  pcVar2 = strchr(__s,0x3d);
  if ((pcVar1 == (char *)0x0) || (pcVar2 <= pcVar1)) {
    this->baseName = __s;
  }
  else {
    lVar3 = (long)pcVar1 - (long)__s << 0x20;
    pcVar2 = (char *)uprv_malloc_63(lVar3 + 0x100000000 >> 0x20);
    this->baseName = pcVar2;
    if (pcVar2 == (char *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      __n = lVar3 >> 0x20;
      strncpy(pcVar2,this->fullName,__n);
      pcVar2[__n] = '\0';
      iVar4 = (int)((long)pcVar1 - (long)__s);
      if (iVar4 < this->variantBegin) {
        this->variantBegin = iVar4;
      }
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }